

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::GPUShaderFP64Test3::writePreamble
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  long lVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"#version 400 core\n\nprecision highp float;\n\n",0x2b);
  if (shader_stage == TESS_EVAL_SHADER) {
    pcVar2 = "layout(isolines, point_mode) in;\n\n";
    lVar1 = 0x22;
  }
  else if (shader_stage == TESS_CONTROL_SHADER) {
    pcVar2 = "layout(vertices = 1) out;\n\n";
    lVar1 = 0x1b;
  }
  else {
    if (shader_stage != GEOMETRY_SHADER) {
      return;
    }
    pcVar2 = "layout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n";
    lVar1 = 0x4c;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
  return;
}

Assistant:

void GPUShaderFP64Test3::writePreamble(std::ostream& stream, shaderStage shader_stage) const
{
	stream << "#version 400 core\n"
			  "\n"
			  "precision highp float;\n"
			  "\n";

	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		break;
	case GEOMETRY_SHADER:
		stream << "layout(points)                   in;\n"
				  "layout(points, max_vertices = 1) out;\n"
				  "\n";
		break;
	case TESS_CONTROL_SHADER:
		stream << "layout(vertices = 1) out;\n"
				  "\n";
		break;
	case TESS_EVAL_SHADER:
		stream << "layout(isolines, point_mode) in;\n"
				  "\n";
		break;
	case VERTEX_SHADER:
		break;
	}
}